

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataBuffer.cpp
# Opt level: O2

void __thiscall DataBuffer::writeStringIndex(DataBuffer *this,String *a)

{
  int data;
  
  writeDWord(this,0x23);
  data = getStringTableIndex(a);
  writeDWord(this,data);
  return;
}

Assistant:

void DataBuffer::writeStringIndex (const String& a)
{
	writeHeader (DataHeader::PushStringIndex);
	writeDWord (getStringTableIndex (a));
}